

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  int iVar1;
  Inst *__src;
  int iVar2;
  int iVar3;
  Inst *__s;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (this->failed_ == false) {
    iVar1 = this->inst_len_;
    iVar3 = n + iVar1;
    if (iVar3 <= this->max_inst_) {
      if (this->inst_cap_ < iVar3) {
        if (this->inst_cap_ == 0) {
          this->inst_cap_ = 8;
        }
        iVar5 = this->inst_cap_;
        iVar4 = iVar5;
        if (iVar5 < iVar3) {
          do {
            iVar5 = iVar4 * 2;
            iVar2 = iVar4 * -2;
            iVar4 = iVar5;
          } while (iVar3 != iVar5 && SBORROW4(iVar3,iVar5) == iVar3 + iVar2 < 0);
          this->inst_cap_ = iVar5;
        }
        uVar6 = 0xffffffffffffffff;
        if (-1 < iVar5) {
          uVar6 = (long)iVar5 * 8;
        }
        __s = (Inst *)operator_new__(uVar6);
        if (iVar5 != 0) {
          memset(__s,0,(long)iVar5 * 8);
        }
        __src = this->inst_;
        memmove(__s,__src,(long)iVar1 * 8);
        memset(__s + iVar1,0,(long)(iVar5 - iVar1) << 3);
        if (__src != (Inst *)0x0) {
          operator_delete__(__src);
        }
        this->inst_ = __s;
      }
      iVar1 = this->inst_len_;
      this->inst_len_ = n + iVar1;
      return iVar1;
    }
  }
  this->failed_ = true;
  return -1;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || inst_len_ + n > max_inst_) {
    failed_ = true;
    return -1;
  }

  if (inst_len_ + n > inst_cap_) {
    if (inst_cap_ == 0)
      inst_cap_ = 8;
    while (inst_len_ + n > inst_cap_)
      inst_cap_ *= 2;
    Prog::Inst* ip = new Prog::Inst[inst_cap_];
    memmove(ip, inst_, inst_len_ * sizeof ip[0]);
    memset(ip + inst_len_, 0, (inst_cap_ - inst_len_) * sizeof ip[0]);
    delete[] inst_;
    inst_ = ip;
  }
  int id = inst_len_;
  inst_len_ += n;
  return id;
}